

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5yy_pop_parser_stack(fts5yyParser *pParser)

{
  fts5yyStackEntry *pfVar1;
  fts5YYMINORTYPE *in_RDX;
  
  pfVar1 = pParser->fts5yytos;
  pParser->fts5yytos = pfVar1 + -1;
  fts5yy_destructor((fts5yyParser *)(ulong)pfVar1->major,(char)pfVar1 + '\b',in_RDX);
  return;
}

Assistant:

static void fts5yy_pop_parser_stack(fts5yyParser *pParser){
  fts5yyStackEntry *fts5yytos;
  assert( pParser->fts5yytos!=0 );
  assert( pParser->fts5yytos > pParser->fts5yystack );
  fts5yytos = pParser->fts5yytos--;
#ifndef NDEBUG
  if( fts5yyTraceFILE ){
    fprintf(fts5yyTraceFILE,"%sPopping %s\n",
      fts5yyTracePrompt,
      fts5yyTokenName[fts5yytos->major]);
  }
#endif
  fts5yy_destructor(pParser, fts5yytos->major, &fts5yytos->minor);
}